

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineLibraryCreateInfoKHR *create_info,ScratchAllocator *alloc)

{
  void *__src;
  undefined8 uVar1;
  VkPipeline *ppVVar2;
  undefined8 *puVar3;
  void *pvVar4;
  size_t size;
  
  puVar3 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar3 != (undefined8 *)0x0) {
    uVar1 = *(undefined8 *)create_info;
    pvVar4 = create_info->pNext;
    ppVVar2 = create_info->pLibraries;
    puVar3[2] = *(undefined8 *)&create_info->libraryCount;
    puVar3[3] = ppVVar2;
    *puVar3 = uVar1;
    puVar3[1] = pvVar4;
  }
  if ((ulong)*(uint *)(puVar3 + 2) == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    __src = (void *)puVar3[3];
    size = (ulong)*(uint *)(puVar3 + 2) << 3;
    pvVar4 = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (pvVar4 != (void *)0x0) {
      memmove(pvVar4,__src,size);
    }
  }
  puVar3[3] = pvVar4;
  return puVar3;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineLibraryCreateInfoKHR *create_info,
                                             ScratchAllocator &alloc)
{
	auto *libraries = copy(create_info, 1, alloc);
	libraries->pLibraries = copy(libraries->pLibraries, libraries->libraryCount, alloc);
	return libraries;
}